

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O1

Boolean convertUTF::isLegalUTF8String(UTF8 *string,size_t length)

{
  char cVar1;
  Boolean BVar2;
  byte *pbVar3;
  byte *source;
  
  pbVar3 = string + length;
  do {
    source = string;
    if (pbVar3 <= source) break;
    BVar2 = false;
    string = source;
    if ((~*source & 0xf8) != 0) {
      cVar1 = trailingBytesForUTF8[*source];
      BVar2 = false;
      if ((source + (long)cVar1 + 1 <= pbVar3) &&
         (BVar2 = anon_unknown_11::isLegalUTF8(source,cVar1 + 1), string = source + (long)cVar1 + 1,
         !BVar2)) {
        string = source;
      }
    }
  } while (BVar2 != false);
  return pbVar3 <= source;
}

Assistant:

Boolean isLegalUTF8String(const UTF8* string, const size_t length)
{
    /* same as above, but verify if the whole passed bytestream consists of valid UTF-8 sequences only. */
    const auto stringEnd = string + length;
    while (string < stringEnd)
    {
        const auto seqLength = trailingBytesForUTF8[*string] + 1;
        const auto seqEnd = string + seqLength;
        /* as the comment for the trailing bytes array notes, valid UTF-8 cannot contain 5- or 6-byte sequences. */
        if (seqLength >= 5 || seqEnd > stringEnd || !isLegalUTF8(string, seqLength))
        {
            return false;
        }
        string = seqEnd;
    }
    return true;
}